

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseNumber(State *state,int *number_out)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  
  pbVar2 = (byte *)state->mangled_cur;
  bVar5 = *pbVar2;
  iVar3 = 1;
  pbVar4 = pbVar2;
  if (bVar5 == 0x6e) {
    pbVar4 = pbVar2 + 1;
    state->mangled_cur = (char *)pbVar4;
    bVar5 = pbVar2[1];
    iVar3 = -1;
  }
  bVar1 = bVar5 - 0x30;
  if (bVar1 < 10) {
    iVar6 = 0;
    do {
      iVar6 = (uint)bVar5 + iVar6 * 10 + -0x30;
      bVar5 = pbVar4[1];
      pbVar4 = pbVar4 + 1;
    } while ((byte)(bVar5 - 0x30) < 10);
    state->mangled_cur = (char *)pbVar4;
    if (number_out != (int *)0x0) {
      *number_out = iVar6 * iVar3;
    }
  }
  return bVar1 < 10;
}

Assistant:

static bool ParseOneCharToken(State *state, const char one_char_token) {
  if (state->mangled_cur[0] == one_char_token) {
    ++state->mangled_cur;
    return true;
  }
  return false;
}